

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_sound.cpp
# Opt level: O1

void S_NoiseDebug(void)

{
  FSoundChan ***pppFVar1;
  long lVar2;
  AActor *actor;
  FSoundChan *pFVar3;
  uint uVar4;
  char *pcVar5;
  uint uVar6;
  int iVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  char *pcVar12;
  char *pcVar13;
  char *pcVar14;
  char *pcVar15;
  FSoundChan *pFVar16;
  float extraout_XMM0_Da;
  FVector3 origin;
  char temp [32];
  FVector3 local_70;
  float local_64;
  float local_60;
  float local_5c;
  char local_58 [8];
  undefined1 local_50;
  
  uVar6 = CleanYfac * 0x20;
  DCanvas::DrawText((DCanvas *)screen,SmallFont,10,0,uVar6,"*** SOUND DEBUG INFO ***",0);
  iVar7 = uVar6 + 8;
  DCanvas::DrawText((DCanvas *)screen,SmallFont,5,0,iVar7,"name",0);
  DCanvas::DrawText((DCanvas *)screen,SmallFont,5,0x46,iVar7,"x",0);
  DCanvas::DrawText((DCanvas *)screen,SmallFont,5,0x78,iVar7,"y",0);
  DCanvas::DrawText((DCanvas *)screen,SmallFont,5,0xaa,iVar7,"z",0);
  DCanvas::DrawText((DCanvas *)screen,SmallFont,5,0xdc,iVar7,"vol",0);
  DCanvas::DrawText((DCanvas *)screen,SmallFont,5,0x104,iVar7,"dist",0);
  DCanvas::DrawText((DCanvas *)screen,SmallFont,5,300,iVar7,"chan",0);
  DCanvas::DrawText((DCanvas *)screen,SmallFont,5,0x154,iVar7,"pri",0);
  DCanvas::DrawText((DCanvas *)screen,SmallFont,5,0x17c,iVar7,"flags",0);
  DCanvas::DrawText((DCanvas *)screen,SmallFont,5,0x1cc,iVar7,"aud",0);
  DCanvas::DrawText((DCanvas *)screen,SmallFont,5,0x208,iVar7,"pos",0);
  if (Channels != (FSoundChan *)0x0) {
    uVar6 = uVar6 | 0x10;
    lVar2 = (&DAT_017e5fc8)[(long)consoleplayer * 0x54];
    pFVar3 = Channels;
    do {
      pFVar16 = pFVar3;
      pFVar3 = pFVar16->NextChan;
    } while (pFVar16->NextChan != (FSoundChan *)0x0);
    local_5c = (float)*(double *)(lVar2 + 0x48);
    local_60 = (float)*(double *)(lVar2 + 0x58);
    local_64 = (float)*(double *)(lVar2 + 0x50);
    do {
      if ((screen->super_DSimpleCanvas).super_DCanvas.Height + -0x10 <= (int)uVar6) break;
      actor = (pFVar16->field_12).Actor;
      CalcPosVel((uint)pFVar16->SourceType,actor,(sector_t *)actor,(FPolyObj *)actor,
                 (pFVar16->field_12).Point,(uint)pFVar16->EntChannel,pFVar16->ChanFlags,&local_70,
                 (FVector3 *)0x0);
      iVar7 = ((uint)pFVar16->ChanFlags >> 7 & 2) + 2;
      FWadCollection::GetLumpName(&Wads,local_58,S_sfx.Array[(pFVar16->SoundID).ID].lumpnum);
      local_50 = 0;
      DCanvas::DrawText((DCanvas *)screen,SmallFont,iVar7,0,uVar6,local_58,0);
      if ((pFVar16->ChanFlags & 1) == 0) {
        DCanvas::DrawText((DCanvas *)screen,SmallFont,iVar7,0x46,uVar6,"---",0);
        DCanvas::DrawText((DCanvas *)screen,SmallFont,iVar7,0x78,uVar6,"---",0);
        DCanvas::DrawText((DCanvas *)screen,SmallFont,iVar7,0xaa,uVar6,"---",0);
        pcVar11 = "---";
      }
      else {
        mysnprintf(local_58,0x20,"%.0f",(double)local_70.X);
        DCanvas::DrawText((DCanvas *)screen,SmallFont,iVar7,0x46,uVar6,local_58,0);
        mysnprintf(local_58,0x20,"%.0f",(double)local_70.Z);
        DCanvas::DrawText((DCanvas *)screen,SmallFont,iVar7,0x78,uVar6,local_58,0);
        mysnprintf(local_58,0x20,"%.0f",(double)local_70.Y);
        DCanvas::DrawText((DCanvas *)screen,SmallFont,iVar7,0xaa,uVar6,local_58,0);
        pcVar11 = "---";
        if (0.0 < (pFVar16->super_FISoundChannel).DistanceScale) {
          c_sqrt((double)((local_70.Z - local_64) * (local_70.Z - local_64) +
                         (local_70.Y - local_60) * (local_70.Y - local_60) +
                         (local_70.X - local_5c) * (local_70.X - local_5c)));
          pcVar11 = local_58;
          mysnprintf(pcVar11,0x20,"%.0f");
        }
      }
      DCanvas::DrawText((DCanvas *)screen,SmallFont,iVar7,0x104,uVar6,pcVar11,0);
      mysnprintf(local_58,0x20,"%.2g",(double)pFVar16->Volume);
      DCanvas::DrawText((DCanvas *)screen,SmallFont,iVar7,0xdc,uVar6,local_58,0);
      mysnprintf(local_58,0x20,"%d",(ulong)pFVar16->EntChannel);
      DCanvas::DrawText((DCanvas *)screen,SmallFont,iVar7,300,uVar6,local_58,0);
      mysnprintf(local_58,0x20,"%d",(ulong)(uint)(int)pFVar16->Priority);
      DCanvas::DrawText((DCanvas *)screen,SmallFont,iVar7,0x154,uVar6,local_58,0);
      uVar4 = pFVar16->ChanFlags;
      pcVar11 = "\x1cD";
      pcVar15 = "\x1cD";
      if ((uVar4 & 1) == 0) {
        pcVar15 = "\x1cM";
      }
      pcVar10 = "\x1cD";
      if ((uVar4 & 8) == 0) {
        pcVar10 = "\x1cM";
      }
      pcVar12 = "\x1cD";
      if ((uVar4 & 0x20) == 0) {
        pcVar12 = "\x1cM";
      }
      pcVar5 = "\x1cD";
      if ((uVar4 & 0x10) == 0) {
        pcVar5 = "\x1cM";
      }
      pcVar8 = "\x1cD";
      if ((uVar4 & 0x40) == 0) {
        pcVar8 = "\x1cM";
      }
      pcVar9 = "\x1cD";
      if (-1 < (char)uVar4) {
        pcVar9 = "\x1cM";
      }
      pcVar13 = "\x1cD";
      if ((uVar4 >> 8 & 1) == 0) {
        pcVar13 = "\x1cM";
      }
      pcVar14 = "\x1cD";
      if ((uVar4 & 2) == 0) {
        pcVar14 = "\x1cM";
      }
      if ((uVar4 >> 0xb & 1) == 0) {
        pcVar11 = "\x1cM";
      }
      mysnprintf(local_58,0x20,"%s3%sZ%sU%sM%sN%sA%sL%sE%sV",pcVar15,pcVar10,pcVar12,pcVar5,pcVar8,
                 pcVar9,pcVar13,pcVar14,pcVar11);
      DCanvas::DrawText((DCanvas *)screen,SmallFont,iVar7,0x17c,uVar6,local_58,0);
      (*GSnd->_vptr_SoundRenderer[0x14])(GSnd,pFVar16);
      mysnprintf(local_58,0x20,"%.4f",(double)extraout_XMM0_Da);
      DCanvas::DrawText((DCanvas *)screen,SmallFont,iVar7,0x1cc,uVar6,local_58,0);
      uVar4 = (*GSnd->_vptr_SoundRenderer[0x13])(GSnd,pFVar16);
      mysnprintf(local_58,0x20,"%u",(ulong)uVar4);
      DCanvas::DrawText((DCanvas *)screen,SmallFont,iVar7,0x208,uVar6,local_58,0);
      uVar6 = uVar6 + 8;
      pppFVar1 = &pFVar16->PrevChan;
      pFVar16 = (FSoundChan *)(*pppFVar1 + -5);
    } while (*pppFVar1 != &Channels);
    V_SetBorderNeedRefresh();
  }
  return;
}

Assistant:

void S_NoiseDebug (void)
{
	FSoundChan *chan;
	FVector3 listener;
	FVector3 origin;
	int y, color;

	y = 32 * CleanYfac;
	screen->DrawText (SmallFont, CR_YELLOW, 0, y, "*** SOUND DEBUG INFO ***", TAG_DONE);
	y += 8;

	screen->DrawText (SmallFont, CR_GOLD, 0, y, "name", TAG_DONE);
	screen->DrawText (SmallFont, CR_GOLD, 70, y, "x", TAG_DONE);
	screen->DrawText (SmallFont, CR_GOLD, 120, y, "y", TAG_DONE);
	screen->DrawText (SmallFont, CR_GOLD, 170, y, "z", TAG_DONE);
	screen->DrawText (SmallFont, CR_GOLD, 220, y, "vol", TAG_DONE);
	screen->DrawText (SmallFont, CR_GOLD, 260, y, "dist", TAG_DONE);
	screen->DrawText (SmallFont, CR_GOLD, 300, y, "chan", TAG_DONE);
	screen->DrawText (SmallFont, CR_GOLD, 340, y, "pri", TAG_DONE);
	screen->DrawText (SmallFont, CR_GOLD, 380, y, "flags", TAG_DONE);
	screen->DrawText (SmallFont, CR_GOLD, 460, y, "aud", TAG_DONE);
	screen->DrawText (SmallFont, CR_GOLD, 520, y, "pos", TAG_DONE);
	y += 8;

	if (Channels == NULL)
	{
		return;
	}


	listener = players[consoleplayer].camera->SoundPos();

	// Display the oldest channel first.
	for (chan = Channels; chan->NextChan != NULL; chan = chan->NextChan)
	{ }
	while (y < SCREENHEIGHT - 16)
	{
		char temp[32];

		CalcPosVel(chan, &origin, NULL);
		color = (chan->ChanFlags & CHAN_LOOP) ? CR_BROWN : CR_GREY;

		// Name
		Wads.GetLumpName (temp, S_sfx[chan->SoundID].lumpnum);
		temp[8] = 0;
		screen->DrawText (SmallFont, color, 0, y, temp, TAG_DONE);

		if (!(chan->ChanFlags & CHAN_IS3D))
		{
			screen->DrawText(SmallFont, color, 70, y, "---", TAG_DONE);		// X
			screen->DrawText(SmallFont, color, 120, y, "---", TAG_DONE);	// Y
			screen->DrawText(SmallFont, color, 170, y, "---", TAG_DONE);	// Z
			screen->DrawText(SmallFont, color, 260, y, "---", TAG_DONE);	// Distance
		}
		else
		{
			// X coordinate
			mysnprintf(temp, countof(temp), "%.0f", origin.X);
			screen->DrawText(SmallFont, color, 70, y, temp, TAG_DONE);

			// Y coordinate
			mysnprintf(temp, countof(temp), "%.0f", origin.Z);
			screen->DrawText(SmallFont, color, 120, y, temp, TAG_DONE);

			// Z coordinate
			mysnprintf(temp, countof(temp), "%.0f", origin.Y);
			screen->DrawText(SmallFont, color, 170, y, temp, TAG_DONE);

			// Distance
			if (chan->DistanceScale > 0)
			{
				mysnprintf(temp, countof(temp), "%.0f", (origin - listener).Length());
				screen->DrawText(SmallFont, color, 260, y, temp, TAG_DONE);
			}
			else
			{
				screen->DrawText(SmallFont, color, 260, y, "---", TAG_DONE);
			}
		}

		// Volume
		mysnprintf(temp, countof(temp), "%.2g", chan->Volume);
		screen->DrawText(SmallFont, color, 220, y, temp, TAG_DONE);

		// Channel
		mysnprintf(temp, countof(temp), "%d", chan->EntChannel);
		screen->DrawText(SmallFont, color, 300, y, temp, TAG_DONE);

		// Priority
		mysnprintf(temp, countof(temp), "%d", chan->Priority);
		screen->DrawText(SmallFont, color, 340, y, temp, TAG_DONE);

		// Flags
		mysnprintf(temp, countof(temp), "%s3%sZ%sU%sM%sN%sA%sL%sE%sV",
			(chan->ChanFlags & CHAN_IS3D)			? TEXTCOLOR_GREEN : TEXTCOLOR_BLACK,
			(chan->ChanFlags & CHAN_LISTENERZ)		? TEXTCOLOR_GREEN : TEXTCOLOR_BLACK,
			(chan->ChanFlags & CHAN_UI)				? TEXTCOLOR_GREEN : TEXTCOLOR_BLACK,
			(chan->ChanFlags & CHAN_MAYBE_LOCAL)	? TEXTCOLOR_GREEN : TEXTCOLOR_BLACK,
			(chan->ChanFlags & CHAN_NOPAUSE)		? TEXTCOLOR_GREEN : TEXTCOLOR_BLACK,
			(chan->ChanFlags & CHAN_AREA)			? TEXTCOLOR_GREEN : TEXTCOLOR_BLACK,
			(chan->ChanFlags & CHAN_LOOP)			? TEXTCOLOR_GREEN : TEXTCOLOR_BLACK,
			(chan->ChanFlags & CHAN_EVICTED)		? TEXTCOLOR_GREEN : TEXTCOLOR_BLACK,
			(chan->ChanFlags & CHAN_VIRTUAL)		? TEXTCOLOR_GREEN : TEXTCOLOR_BLACK);
		screen->DrawText(SmallFont, color, 380, y, temp, TAG_DONE);

		// Audibility
		mysnprintf(temp, countof(temp), "%.4f", GSnd->GetAudibility(chan));
		screen->DrawText(SmallFont, color, 460, y, temp, TAG_DONE);

		// Position
		mysnprintf(temp, countof(temp), "%u", GSnd->GetPosition(chan));
		screen->DrawText(SmallFont, color, 520, y, temp, TAG_DONE);


		y += 8;
		if (chan->PrevChan == &Channels)
		{
			break;
		}
		chan = (FSoundChan *)((size_t)chan->PrevChan - myoffsetof(FSoundChan, NextChan));
	}
	V_SetBorderNeedRefresh();
}